

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory *
udata_openChoice_63(char *path,char *type,char *name,UDataMemoryIsAcceptable *isAcceptable,
                   void *context,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UDataMemory *pUVar2;
  UErrorCode *pErrorCode_local;
  void *context_local;
  UDataMemoryIsAcceptable *isAcceptable_local;
  char *name_local;
  char *type_local;
  char *path_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return (UDataMemory *)0x0;
  }
  if ((name != (char *)0x0) && ((*name != '\0' && (isAcceptable != (UDataMemoryIsAcceptable *)0x0)))
     ) {
    pUVar2 = doOpenChoice(path,type,name,isAcceptable,context,pErrorCode);
    return pUVar2;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return (UDataMemory *)0x0;
}

Assistant:

U_CAPI UDataMemory * U_EXPORT2
udata_openChoice(const char *path, const char *type, const char *name,
                 UDataMemoryIsAcceptable *isAcceptable, void *context,
                 UErrorCode *pErrorCode) {
#ifdef UDATA_DEBUG
  fprintf(stderr, "udata_openChoice(): Opening: %s : %s . %s\n", (path?path:"NULL"), name, type);
#endif

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    } else if(name==NULL || *name==0 || isAcceptable==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    } else {
        return doOpenChoice(path, type, name, isAcceptable, context, pErrorCode);
    }
}